

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

ALLEGRO_USTR * al_path_ustr(ALLEGRO_PATH *path,char delim)

{
  ALLEGRO_USTR *us1;
  ALLEGRO_USTR *us2;
  undefined7 in_register_00000031;
  ulong uVar1;
  
  us1 = path->full_string;
  al_ustr_assign(us1,path->drive);
  for (uVar1 = 0; uVar1 < (path->segments)._size; uVar1 = (ulong)((uint)uVar1 + 1)) {
    us2 = get_segment(path,(uint)uVar1);
    al_ustr_append(us1,us2);
    al_ustr_append_chr(us1,(int32_t)CONCAT71(in_register_00000031,delim));
  }
  al_ustr_append(us1,path->filename);
  return path->full_string;
}

Assistant:

const ALLEGRO_USTR *al_path_ustr(const ALLEGRO_PATH *path, char delim)
{
   path_to_ustr(path, delim, path->full_string);
   return path->full_string;
}